

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O3

void __thiscall
spirv_cross::CompilerGLSL::emit_push_constant_block_glsl(CompilerGLSL *this,SPIRVariable *var)

{
  bool bVar1;
  SPIRType *type;
  
  type = Variant::get<spirv_cross::SPIRType>
                   ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr +
                    *(uint *)&(var->super_IVariant).field_0xc);
  Compiler::unset_decoration(&this->super_Compiler,(ID)(var->super_IVariant).self.id,Binding);
  Compiler::unset_decoration
            (&this->super_Compiler,(ID)(var->super_IVariant).self.id,DecorationDescriptorSet);
  bVar1 = Compiler::has_decoration(&this->super_Compiler,(ID)(type->super_IVariant).self.id,Block);
  Compiler::unset_decoration(&this->super_Compiler,(ID)(type->super_IVariant).self.id,Block);
  emit_struct(this,type);
  if (bVar1) {
    Compiler::set_decoration(&this->super_Compiler,(ID)(type->super_IVariant).self.id,Block,0);
  }
  (*(this->super_Compiler)._vptr_Compiler[0x22])(this,var);
  statement<char_const(&)[1]>(this,(char (*) [1])0x3dee59);
  return;
}

Assistant:

void CompilerGLSL::emit_push_constant_block_glsl(const SPIRVariable &var)
{
	// OpenGL has no concept of push constant blocks, implement it as a uniform struct.
	auto &type = get<SPIRType>(var.basetype);

	unset_decoration(var.self, DecorationBinding);
	unset_decoration(var.self, DecorationDescriptorSet);

#if 0
    if (flags & ((1ull << DecorationBinding) | (1ull << DecorationDescriptorSet)))
        SPIRV_CROSS_THROW("Push constant blocks cannot be compiled to GLSL with Binding or Set syntax. "
                            "Remap to location with reflection API first or disable these decorations.");
#endif

	// We're emitting the push constant block as a regular struct, so disable the block qualifier temporarily.
	// Otherwise, we will end up emitting layout() qualifiers on naked structs which is not allowed.
	bool block_flag = has_decoration(type.self, DecorationBlock);
	unset_decoration(type.self, DecorationBlock);

	emit_struct(type);

	if (block_flag)
		set_decoration(type.self, DecorationBlock);

	emit_uniform(var);
	statement("");
}